

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepTiledInputFile::setFrameBuffer(DeepTiledInputFile *this,DeepFrameBuffer *frameBuffer)

{
  _Base_ptr p_Var1;
  byte bVar2;
  byte bVar3;
  _Rb_tree_color _Var4;
  Data *pDVar5;
  _Base_ptr p_Var6;
  pointer ppTVar7;
  _Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  *this_00;
  pointer ppTVar8;
  int iVar9;
  ChannelList *this_01;
  const_iterator cVar10;
  ConstIterator CVar11;
  ConstIterator CVar12;
  const_iterator cVar13;
  Slice *pSVar14;
  pointer ppTVar15;
  ostream *poVar16;
  char *pcVar17;
  ArgExc *pAVar18;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar19;
  bool bVar20;
  const_iterator cVar21;
  size_t i;
  ulong uVar22;
  pointer ppTVar23;
  ulong __n_00;
  value_type local_1d8;
  DeepFrameBuffer *local_1d0;
  Lock local_1c8;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  slices;
  
  local_1c8._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  this_01 = Header::channels(&this->_data->header);
  for (cVar10._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
      CVar11 = DeepFrameBuffer::end(frameBuffer),
      (const_iterator)cVar10._M_node != CVar11._i._M_node;
      cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node)) {
    CVar12 = ChannelList::find(this_01,(char *)(cVar10._M_node + 1));
    cVar13._M_node = (_Base_ptr)ChannelList::end(this_01);
    if ((CVar12._i._M_node != (const_iterator)cVar13._M_node) &&
       ((*(_Rb_tree_color *)((long)CVar12._i._M_node + 0x124) != cVar10._M_node[10]._M_color ||
        (*(int *)((long)CVar12._i._M_node + 0x128) != *(int *)&cVar10._M_node[10].field_0x4)))) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&slices);
      poVar16 = std::operator<<((ostream *)
                                &slices.
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "X and/or y subsampling factors of \"");
      poVar16 = std::operator<<(poVar16,(char *)((long)CVar12._i._M_node + 0x20));
      poVar16 = std::operator<<(poVar16,"\" channel of input file \"");
      pcVar17 = fileName(this);
      poVar16 = std::operator<<(poVar16,pcVar17);
      std::operator<<(poVar16,"\" are not compatible with the frame buffer\'s subsampling factors.")
      ;
      pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar18,(stringstream *)&slices);
      __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  pSVar14 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar14->base == (char *)0x0) {
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar18,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar5 = this->_data;
  pDVar5->sampleCountSliceBase = pSVar14->base;
  sVar19 = pSVar14->yStride;
  pDVar5->sampleCountXStride = pSVar14->xStride;
  pDVar5->sampleCountYStride = sVar19;
  pDVar5->sampleCountXTileCoords = (uint)pSVar14->xTileCoords;
  pDVar5->sampleCountYTileCoords = (uint)pSVar14->yTileCoords;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar13._M_node = (_Base_ptr)ChannelList::begin(this_01);
  cVar10._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
  local_1d0 = frameBuffer;
  for (; CVar11 = DeepFrameBuffer::end(frameBuffer),
      (const_iterator)cVar10._M_node != CVar11._i._M_node;
      cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node)) {
    while ((CVar12 = ChannelList::end(this_01), (const_iterator)cVar13._M_node != CVar12._i._M_node
           && (iVar9 = strcmp((char *)(cVar13._M_node + 1),(char *)(cVar10._M_node + 1)), iVar9 < 0)
           )) {
      local_1d8 = (value_type)operator_new(0x40);
      _Var4 = cVar13._M_node[9]._M_color;
      local_1d8->typeInFrameBuffer = _Var4;
      local_1d8->typeInFile = _Var4;
      local_1d8->pointerArrayBase = (char *)0x0;
      local_1d8->xStride = 0;
      local_1d8->yStride = 0;
      local_1d8->sampleStride = 0;
      local_1d8->fill = false;
      local_1d8->skip = true;
      local_1d8->fillValue = 0.0;
      local_1d8->xTileCoords = 0;
      local_1d8->yTileCoords = 0;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ::push_back(&slices,&local_1d8);
      cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
    }
    CVar12 = ChannelList::end(this_01);
    if (((const_iterator)cVar13._M_node == CVar12._i._M_node) ||
       (iVar9 = strcmp((char *)(cVar13._M_node + 1),(char *)(cVar10._M_node + 1)), 0 < iVar9)) {
      bVar20 = true;
    }
    else {
      bVar20 = false;
    }
    local_1d8 = (value_type)operator_new(0x40);
    p_Var6 = cVar10._M_node[9]._M_parent;
    cVar21._M_node = cVar13._M_node;
    if (bVar20 != false) {
      cVar21._M_node = cVar10._M_node;
    }
    _Var4 = cVar21._M_node[9]._M_color;
    iVar9 = *(int *)((long)&cVar10._M_node[10]._M_left + 4);
    p_Var1 = cVar10._M_node[10]._M_parent;
    bVar2 = *(byte *)&cVar10._M_node[10]._M_left;
    bVar3 = *(byte *)((long)&cVar10._M_node[10]._M_left + 1);
    local_1d8->typeInFrameBuffer = cVar10._M_node[9]._M_color;
    local_1d8->typeInFile = _Var4;
    local_1d8->pointerArrayBase = (char *)p_Var6;
    p_Var6 = cVar10._M_node[9]._M_right;
    local_1d8->xStride = (size_t)cVar10._M_node[9]._M_left;
    local_1d8->yStride = (size_t)p_Var6;
    local_1d8->sampleStride = (long)iVar9;
    local_1d8->fill = bVar20;
    local_1d8->skip = false;
    local_1d8->fillValue = (double)p_Var1;
    local_1d8->xTileCoords = (uint)bVar2;
    local_1d8->yTileCoords = (uint)bVar3;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ::push_back(&slices,&local_1d8);
    CVar12 = ChannelList::end(this_01);
    if (bVar20 == false && (const_iterator)cVar13._M_node != CVar12._i._M_node) {
      cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
    }
    frameBuffer = local_1d0;
  }
  for (; CVar12 = ChannelList::end(this_01), (const_iterator)cVar13._M_node != CVar12._i._M_node;
      cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node)) {
    local_1d8 = (value_type)operator_new(0x40);
    _Var4 = cVar13._M_node[9]._M_color;
    local_1d8->typeInFrameBuffer = _Var4;
    local_1d8->typeInFile = _Var4;
    local_1d8->pointerArrayBase = (char *)0x0;
    local_1d8->xStride = 0;
    local_1d8->yStride = 0;
    local_1d8->sampleStride = 0;
    local_1d8->fill = false;
    local_1d8->skip = true;
    local_1d8->fillValue = 0.0;
    local_1d8->xTileCoords = 0;
    local_1d8->yTileCoords = 0;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ::push_back(&slices,&local_1d8);
  }
  DeepFrameBuffer::operator=(&this->_data->frameBuffer,frameBuffer);
  uVar22 = 0;
  while( true ) {
    ppTVar8 = slices.
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppTVar23 = slices.
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pDVar5 = this->_data;
    ppTVar15 = (pDVar5->slices).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar7 = (pDVar5->slices).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)ppTVar7 - (long)ppTVar15;
    if ((ulong)((long)__n >> 3) <= uVar22) break;
    frameBuffer = (DeepFrameBuffer *)0x40;
    operator_delete(ppTVar15[uVar22],0x40);
    uVar22 = uVar22 + 1;
  }
  uVar22 = (long)slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pDVar5->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar15) < uVar22) {
    ppTVar15 = std::
               _Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                              *)((long)uVar22 >> 3),(size_t)frameBuffer);
    sVar19 = extraout_RDX;
    if (ppTVar8 != ppTVar23) {
      memcpy(ppTVar15,ppTVar23,uVar22);
      sVar19 = extraout_RDX_00;
    }
    this_00 = (_Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
               *)(pDVar5->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(pDVar5->slices).
                                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),sVar19);
    (pDVar5->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar15;
    (pDVar5->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppTVar15 + uVar22);
  }
  else {
    if (__n < uVar22) {
      if (ppTVar7 != ppTVar15) {
        memmove(ppTVar15,slices.
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        ppTVar7 = (pDVar5->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppTVar7 -
              (long)(pDVar5->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      ppTVar15 = ppTVar7;
      ppTVar23 = (pointer)((long)ppTVar23 + __n);
      __n_00 = (long)ppTVar8 - (long)ppTVar23;
      if (__n_00 == 0) goto LAB_0046c6b4;
    }
    else {
      __n_00 = uVar22;
      if (slices.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          slices.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_0046c6b4;
    }
    memmove(ppTVar15,ppTVar23,__n_00);
  }
LAB_0046c6b4:
  (pDVar5->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar22 + (long)(pDVar5->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ::~vector(&slices);
  IlmThread_2_5::Lock::~Lock(&local_1c8);
  return;
}

Assistant:

void
DeepTiledInputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Set the frame buffer
    //

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
                                "of \"" << i.name() << "\" channel "
                                "of input file \"" << fileName() << "\" are "
                                "not compatible with the frame buffer's "
                                "subsampling factors.");
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<TInSliceInfo*> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (new TInSliceInfo (i.channel().type,
                                                NULL,
                                                i.channel().type,
                                                0,      // xStride
                                                0,      // yStride
                                                0,      // sampleStride
                                                false,  // fill
                                                true,   // skip
                                                0.0));  // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (new TInSliceInfo (j.slice().type,
                                            j.slice().base,
                                            fill? j.slice().type: i.channel().type,
                                            j.slice().xStride,
                                            j.slice().yStride,
                                            j.slice().sampleStride,
                                            fill,
                                            false, // skip
                                            j.slice().fillValue,
                                            (j.slice().xTileCoords)? 1: 0,
                                            (j.slice().yTileCoords)? 1: 0));


        if (i != channels.end() && !fill)
            ++i;
    }

    // (TODO) inspect the following code. It's additional to the scanline input file.
    // Is this needed?

    while (i != channels.end())
    {
        //
        // Channel i is present in the file but not
        // in the frame buffer; data for channel i
        // will be skipped during readPixels().
        //

        slices.push_back (new TInSliceInfo (i.channel().type,
                                            NULL,
                                            i.channel().type,
                                            0, // xStride
                                            0, // yStride
                                            0, // sampleStride
                                            false,  // fill
                                            true, // skip
                                            0.0)); // fillValue
        ++i;
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
}